

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSocket.cpp
# Opt level: O3

void uWS::HTTPSocket<false>::onData(Socket s,char *data,int length)

{
  char *pcVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  int iVar19;
  long lVar20;
  undefined4 *puVar21;
  code *pcVar22;
  size_t i;
  ulong uVar23;
  HTTPSocket<false> httpSocket;
  HTTPParser httpParser;
  int enable;
  Socket in_stack_ffffffffffffff60;
  HTTPParser local_90;
  uv_poll_t *local_68;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  HTTPSocket((HTTPSocket<false> *)&stack0xffffffffffffff60,s);
  puVar2 = (undefined4 *)(in_stack_ffffffffffffff60.p)->data;
  if ((ulong)(*(long *)(puVar2 + 0x12) + (long)length) < 0x1401) {
    pcVar1 = (char *)(puVar2 + 0x10);
    std::__cxx11::string::append(pcVar1,(ulong)data);
    lVar20 = std::__cxx11::string::find(pcVar1,0x11764e,0);
    if (lVar20 != -1) {
      local_5c = 1;
      setsockopt(((in_stack_ffffffffffffff60.p)->io_watcher).fd,6,1,&local_5c,4);
      std::__cxx11::string::resize((ulong)pcVar1,(char)*(undefined8 *)(puVar2 + 0x12) + '\x12');
      HTTPParser::HTTPParser(&local_90,*(char **)(puVar2 + 0x10));
      HTTPParser::operator++(&local_90,0);
      do {
        if (local_90.key.second == 7) {
          uVar23 = 0;
          do {
            pcVar1 = local_90.key.first;
            iVar19 = tolower((int)local_90.key.first[uVar23]);
            pcVar1[uVar23] = (char)iVar19;
            uVar23 = uVar23 + 1;
          } while (uVar23 < local_90.key.second);
          if (local_90.value.second != 0) {
            uVar23 = 0;
            do {
              pcVar1 = local_90.value.first;
              iVar19 = tolower((int)local_90.value.first[uVar23]);
              pcVar1[uVar23] = (char)iVar19;
              uVar23 = uVar23 + 1;
            } while (uVar23 < local_90.value.second);
          }
          iVar19 = strncmp(local_90.key.first,"upgrade",local_90.key.second);
          if (iVar19 == 0) {
            iVar19 = strncmp(local_90.value.first,"websocket",9);
            if (iVar19 == 0) {
              puVar21 = (undefined4 *)operator_new(0xa0);
              uVar4 = puVar2[1];
              uVar5 = puVar2[2];
              uVar6 = puVar2[3];
              uVar7 = puVar2[4];
              uVar8 = puVar2[5];
              uVar9 = puVar2[6];
              uVar10 = puVar2[7];
              uVar11 = puVar2[8];
              uVar12 = puVar2[9];
              uVar13 = puVar2[10];
              uVar14 = puVar2[0xb];
              uVar15 = puVar2[0xc];
              uVar16 = puVar2[0xd];
              uVar17 = puVar2[0xe];
              uVar18 = puVar2[0xf];
              *puVar21 = *puVar2;
              puVar21[1] = uVar4;
              puVar21[2] = uVar5;
              puVar21[3] = uVar6;
              puVar21[4] = uVar7;
              puVar21[5] = uVar8;
              puVar21[6] = uVar9;
              puVar21[7] = uVar10;
              puVar21[8] = uVar11;
              puVar21[9] = uVar12;
              puVar21[10] = uVar13;
              puVar21[0xb] = uVar14;
              puVar21[0xc] = uVar15;
              puVar21[0xd] = uVar16;
              puVar21[0xe] = uVar17;
              puVar21[0xf] = uVar18;
              puVar21[0x10] = 0x1ff0000;
              puVar21[0x14] = 0;
              *(undefined4 **)(puVar21 + 0x16) = puVar21 + 0x1a;
              *(undefined8 *)(puVar21 + 0x18) = 0;
              *(undefined1 *)(puVar21 + 0x1a) = 0;
              *(undefined4 **)(puVar21 + 0x1e) = puVar21 + 0x22;
              *(undefined8 *)(puVar21 + 0x20) = 0;
              *(undefined1 *)(puVar21 + 0x22) = 0;
              *(undefined2 *)(puVar21 + 0x26) = 0;
              (s.p)->data = puVar21;
              if (*(long *)(puVar21 + 2) == 0) {
                pcVar22 = uS::Socket::io_cb<uWS::WebSocket<false>>;
              }
              else {
                pcVar22 = uS::Socket::ssl_io_cb<uWS::WebSocket<false>>;
              }
              uv_poll_start(s.p,puVar21[6],pcVar22);
              *(undefined4 *)((long)(s.p)->data + 0x18) = 1;
              uS::Socket::cancelTimeout((Socket *)&stack0xffffffffffffff60);
              *(undefined8 *)((long)(in_stack_ffffffffffffff60.p)->data + 0x10) =
                   *(undefined8 *)(puVar2 + 0x28);
              Group<false>::addWebSocket(*(s.p)->data,s.p);
              lVar3 = *(s.p)->data;
              local_48 = 0;
              uStack_40 = 0;
              local_58 = 0;
              uStack_50 = 0;
              local_68 = s.p;
              if (*(long *)(lVar3 + 0x90) != 0) {
                (**(code **)(lVar3 + 0x98))(lVar3 + 0x80,&local_68,&local_58);
                iVar19 = uv_is_closing(s.p);
                if ((iVar19 == 0) && (*(char *)((long)(s.p)->data + 0x1c) == '\0')) {
                  WebSocketProtocol<false>::consume
                            ((WebSocketProtocol<false> *)((long)(s.p)->data + 0x40),
                             (char *)(*(long *)(puVar2 + 0x10) + lVar20 + 4),
                             (puVar2[0x12] - (int)lVar20) - 0x16,s.p);
                }
                if (*(undefined4 **)(puVar2 + 0x20) != puVar2 + 0x24) {
                  operator_delete(*(undefined4 **)(puVar2 + 0x20));
                }
                if (*(undefined4 **)(puVar2 + 0x18) != puVar2 + 0x1c) {
                  operator_delete(*(undefined4 **)(puVar2 + 0x18));
                }
                if (*(undefined4 **)(puVar2 + 0x10) != puVar2 + 0x14) {
                  operator_delete(*(undefined4 **)(puVar2 + 0x10));
                }
                operator_delete(puVar2);
                return;
              }
              std::__throw_bad_function_call();
            }
            goto LAB_0011625c;
          }
        }
        else if (local_90.key.second == 0) goto LAB_0011625c;
        HTTPParser::operator++(&local_90,0);
      } while( true );
    }
  }
  else {
LAB_0011625c:
    onEnd(in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void HTTPSocket<isServer>::onData(uS::Socket s, char *data, int length) {
    HTTPSocket httpSocket(s);
    HTTPSocket::Data *httpData = httpSocket.getData();

    // 5k = force close!
    if (httpData->httpBuffer.length() + length > 1024 * 5) {
        httpSocket.onEnd(s);
        return;
    }

    httpData->httpBuffer.append(data, length);

    size_t endOfHTTPBuffer = httpData->httpBuffer.find("\r\n\r\n");
    if (endOfHTTPBuffer != std::string::npos) {

        int enable = 1;
        setsockopt(httpSocket.getFd(), IPPROTO_TCP, TCP_NODELAY, &enable, sizeof(enable));

        if (isServer) {

            HTTPParser httpParser = (char *) httpData->httpBuffer.data();
            std::pair<char *, size_t> secKey = {}, extensions = {}, subprotocol = {}, path = httpParser.value;
            for (httpParser++; httpParser.key.second; httpParser++) {
                if (httpParser.key.second == 17 || httpParser.key.second == 24 || httpParser.key.second == 22) {
                    // lowercase the key
                    for (size_t i = 0; i < httpParser.key.second; i++) {
                        httpParser.key.first[i] = tolower(httpParser.key.first[i]);
                    }
                    if (!strncmp(httpParser.key.first, "sec-websocket-key", httpParser.key.second)) {
                        secKey = httpParser.value;
                    } else if (!strncmp(httpParser.key.first, "sec-websocket-extensions", httpParser.key.second)) {
                        extensions = httpParser.value;
                    } else if (!strncmp(httpParser.key.first, "sec-websocket-protocol", httpParser.key.second)) {
                        subprotocol = httpParser.value;
                    }
                }
            }

            if (secKey.first && secKey.second == 24) {

                // this needs to be part of upgrade itself, and shared with Hub::upgrade!
                bool perMessageDeflate = false;
                std::string extensionsResponse;
                if (extensions.first) {
                    Group<isServer> *group = (Group<isServer> *) s.getNodeData(s.getSocketData());
                    ExtensionsNegotiator<uWS::SERVER> extensionsNegotiator(group->extensionOptions);
                    extensionsNegotiator.readOffer(std::string(extensions.first, extensions.second));
                    extensionsResponse = extensionsNegotiator.generateOffer();
                    if (extensionsNegotiator.getNegotiatedOptions() & PERMESSAGE_DEFLATE) {
                        perMessageDeflate = true;
                    }
                }

                if (httpSocket.upgrade(secKey.first, extensionsResponse.data(), extensionsResponse.length(), subprotocol.first, subprotocol.second)) {
                    s.cancelTimeout();
                    s.enterState<WebSocket<SERVER>>(new WebSocket<SERVER>::Data(perMessageDeflate, httpData));

                    ((Group<SERVER> *) s.getSocketData()->nodeData)->addWebSocket(s);
                    //s.cork(true);
                    ((Group<SERVER> *) s.getSocketData()->nodeData)->connectionHandler(WebSocket<SERVER>(s), {path.first, subprotocol.first,
                                                                                                              path.second, subprotocol.second});
                    //s.cork(false);
                    delete httpData;
                }
            } else {
                httpSocket.onEnd(s);
            }
        } else {
            httpData->httpBuffer.resize(httpData->httpBuffer.length() + WebSocketProtocol<uWS::CLIENT>::CONSUME_POST_PADDING);

            bool isUpgrade = false;
            HTTPParser httpParser = (char *) httpData->httpBuffer.data();
            //std::pair<char *, size_t> secKey = {}, extensions = {};
            for (httpParser++; httpParser.key.second; httpParser++) {
                if (httpParser.key.second == 7) {
                    // lowercase the key
                    for (size_t i = 0; i < httpParser.key.second; i++) {
                        httpParser.key.first[i] = tolower(httpParser.key.first[i]);
                    }
                    // lowercase the value
                    for (size_t i = 0; i < httpParser.value.second; i++) {
                        httpParser.value.first[i] = tolower(httpParser.value.first[i]);
                    }
                    if (!strncmp(httpParser.key.first, "upgrade", httpParser.key.second)) {
                        if (!strncmp(httpParser.value.first, "websocket", 9)) {
                            isUpgrade = true;
                        }
                        break;
                    }
                }
            }

            if (isUpgrade) {
                s.enterState<WebSocket<CLIENT>>(new WebSocket<CLIENT>::Data(false, httpData));

                //s.cork(true);
                httpSocket.cancelTimeout();
                httpSocket.setUserData(httpData->httpUser);
                ((Group<CLIENT> *) s.getSocketData()->nodeData)->addWebSocket(s);
                ((Group<CLIENT> *) s.getSocketData()->nodeData)->connectionHandler(WebSocket<CLIENT>(s), {nullptr, nullptr, 0, 0});
                //s.cork(false);

                if (!(s.isClosed() || s.isShuttingDown())) {
                    WebSocketProtocol<CLIENT> *kws = (WebSocketProtocol<CLIENT> *) ((WebSocket<CLIENT>::Data *) s.getSocketData());
                    kws->consume((char *) httpData->httpBuffer.data() + endOfHTTPBuffer + 4, httpData->httpBuffer.length() - endOfHTTPBuffer - 4 - WebSocketProtocol<uWS::CLIENT>::CONSUME_POST_PADDING, s);
                }

                delete httpData;
            } else {
                httpSocket.onEnd(s);
            }
        }
    }
}